

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O2

void __thiscall ZXing::BitMatrix::setRegion(BitMatrix *this,int left,int top,int width,int height)

{
  int iVar1;
  invalid_argument *this_00;
  int iVar2;
  long lVar3;
  
  if ((top | left) < 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"BitMatrix::setRegion(): Left and top must be nonnegative");
  }
  else if ((width < 1) || (height < 1)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"BitMatrix::setRegion(): Height and width must be at least 1");
  }
  else {
    iVar2 = height + top;
    if (iVar2 <= this->_height) {
      if (width + left <= this->_width) {
        for (; top < iVar2; top = top + 1) {
          iVar1 = this->_width;
          for (lVar3 = (long)left; lVar3 < width + left; lVar3 = lVar3 + 1) {
            (this->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3 + iVar1 * top] = 0xff;
          }
        }
        return;
      }
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"BitMatrix::setRegion(): The region must fit inside the matrix");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
BitMatrix::setRegion(int left, int top, int width, int height)
{
	if (top < 0 || left < 0) {
		throw std::invalid_argument("BitMatrix::setRegion(): Left and top must be nonnegative");
	}
	if (height < 1 || width < 1) {
		throw std::invalid_argument("BitMatrix::setRegion(): Height and width must be at least 1");
	}
	int right = left + width;
	int bottom = top + height;
	if (bottom > _height || right > _width) {
		throw std::invalid_argument("BitMatrix::setRegion(): The region must fit inside the matrix");
	}
	for (int y = top; y < bottom; y++) {
		auto offset = y * _width;
		for (int x = left; x < right; x++) {
			_bits[offset + x] = SET_V;
		}
	}
}